

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

bool __thiscall
soplex::SoPlexBase<double>::_isRefinementOver
          (SoPlexBase<double> *this,bool *primalFeasible,bool *dualFeasible,
          Rational *boundsViolation,Rational *sideViolation,Rational *redCostViolation,
          Rational *dualViolation,int minIRRoundsRemaining,bool *stoppedTime,bool *stoppedIter,
          int numFailedRefinements)

{
  Verbosity VVar1;
  type_conflict5 tVar2;
  bool bVar3;
  Verbosity old_verbosity;
  
  tVar2 = boost::multiprecision::operator<=(boundsViolation,&this->_rationalFeastol);
  if (tVar2) {
    tVar2 = boost::multiprecision::operator<=(sideViolation,&this->_rationalFeastol);
  }
  else {
    tVar2 = false;
  }
  *primalFeasible = tVar2;
  tVar2 = boost::multiprecision::operator<=(redCostViolation,&this->_rationalOpttol);
  if (tVar2) {
    tVar2 = boost::multiprecision::operator<=(dualViolation,&this->_rationalOpttol);
  }
  else {
    tVar2 = false;
  }
  *dualFeasible = tVar2;
  if ((tVar2 != false) && (*primalFeasible != false)) {
    VVar1 = (this->spxout).m_verbosity;
    if (minIRRoundsRemaining < 0) {
      if ((int)VVar1 < 3) {
        return true;
      }
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(&this->spxout,"Tolerances reached.\n");
      (this->spxout).m_verbosity = VVar1;
      return true;
    }
    if (2 < (int)VVar1) {
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(&this->spxout,
                         "Tolerances reached but minIRRoundsRemaining forcing additional refinement rounds.\n"
                        );
      (this->spxout).m_verbosity = VVar1;
    }
  }
  bVar3 = _isSolveStopped(this,stoppedTime,stoppedIter);
  return 2 < numFailedRefinements || bVar3;
}

Assistant:

bool SoPlexBase<R>::_isRefinementOver(
   bool& primalFeasible,
   bool& dualFeasible,
   Rational& boundsViolation,
   Rational& sideViolation,
   Rational& redCostViolation,
   Rational& dualViolation,
   int minIRRoundsRemaining,
   bool& stoppedTime,
   bool& stoppedIter,
   int numFailedRefinements)
{
   // terminate if tolerances are satisfied
   primalFeasible = (boundsViolation <= _rationalFeastol && sideViolation <= _rationalFeastol);
   dualFeasible = (redCostViolation <= _rationalOpttol && dualViolation <= _rationalOpttol);

   if(primalFeasible && dualFeasible)
   {
      if(minIRRoundsRemaining < 0)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tolerances reached.\n");
         return true;
      }
      else
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Tolerances reached but minIRRoundsRemaining forcing additional refinement rounds.\n");
      }
   }

   // terminate if some limit is reached
   if(_isSolveStopped(stoppedTime, stoppedIter) || numFailedRefinements > 2)
      return true;

   return false;
}